

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_io.c
# Opt level: O1

int unix_read_func(void *conn,void *buffer,size_t length,int *errno_p,char **result_p)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  
  sVar4 = read((int)conn,buffer,length);
  iVar3 = (int)sVar4;
  if (iVar3 == -1) {
    piVar5 = __errno_location();
    iVar7 = *piVar5;
    if (errno_p != (int *)0x0) {
      *errno_p = iVar7;
    }
    if ((iVar7 == 0xb) || (iVar3 = -1, iVar7 == 4)) {
      if (errno_p != (int *)0x0) {
        *errno_p = 0;
      }
      iVar3 = 0;
    }
    if ((iVar7 != 0xb) && (iVar7 != 4)) {
      return -1;
    }
  }
  else if (iVar3 == 0) {
    if (result_p != (char **)0x0) {
      *result_p = "End of file";
    }
    if (errno_p == (int *)0x0) {
      return 0;
    }
    *errno_p = 0;
    return 0;
  }
  iVar7 = (int)length;
  if (0 < iVar7 - iVar3) {
    iVar6 = -1;
    uVar8 = iVar7 - iVar3;
    do {
      sVar4 = read((int)conn,(void *)((long)buffer + (length - uVar8)),(ulong)uVar8);
      iVar3 = (int)sVar4;
      if (iVar3 == -1) {
        piVar5 = __errno_location();
        iVar1 = *piVar5;
        if (errno_p != (int *)0x0) {
          *errno_p = iVar1;
        }
        if ((iVar1 == 4) || (iVar1 == 0xb)) {
          iVar3 = 0;
          if (errno_p != (int *)0x0) {
            *errno_p = 0;
          }
        }
        else {
          iVar6 = iVar7 - uVar8;
          iVar3 = -1;
        }
        if ((iVar1 != 0xb) && (iVar1 != 4)) {
          return iVar6;
        }
      }
      else if (iVar3 == 0) {
        if (result_p != (char **)0x0) {
          *result_p = "End of file";
        }
        if (errno_p != (int *)0x0) {
          *errno_p = 0;
        }
        length = (size_t)(iVar7 - uVar8);
        break;
      }
      uVar9 = uVar8 - iVar3;
      bVar2 = iVar3 <= (int)uVar8;
      uVar8 = uVar9;
    } while (uVar9 != 0 && bVar2);
  }
  return (int)length;
}

Assistant:

static int
unix_read_func(void *conn, void *buffer, size_t length, int *errno_p, char **result_p)
{
    int left = length;
    int iget;
    int fd = (int) (long) conn;

    iget = read(fd, (char *) buffer, length);
    if (iget == 0) {
	if (result_p) *result_p = "End of file";
	if (errno_p) *errno_p = 0;
	return 0;		/* end of file */
    } else if (iget == -1) {
	int lerrno = errno;
	if (errno_p) *errno_p = lerrno;
	if ((lerrno != EWOULDBLOCK) &&
	    (lerrno != EAGAIN) &&
	    (lerrno != EINTR)) {
	    /* serious error */
	    return -1;
	} else {
	    if (errno_p) *errno_p = 0;
	    iget = 0;
	}
    }
    left = length - iget;
    while (left > 0) {
	iget = read(fd, (char *) buffer + length - left, left);
	if (iget == 0) {
	    if (result_p) *result_p = "End of file";
	    if (errno_p) *errno_p = 0;
	    return length - left;	/* end of file */
	} else if (iget == -1) {
	    int lerrno = errno;
	    if (errno_p) *errno_p = errno;
	    if ((lerrno != EWOULDBLOCK) &&
		(lerrno != EAGAIN) &&
		(lerrno != EINTR)) {
		/* serious error */
		return (length - left);
	    } else {
		if (errno_p) *errno_p = 0;
		iget = 0;
	    }
	}
	left -= iget;
    }
    return length;
}